

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8 * google::protobuf::internal::WireFormat::InternalSerializeUnknownMessageSetItemsToArray
                  (UnknownFieldSet *unknown_fields,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  Type TVar2;
  uint32 value;
  UnknownField *this;
  uint8 *puVar3;
  uint8 *in_RSI;
  EpsCopyOutputStream *unaff_retaddr;
  uint8 *in_stack_00000008;
  UnknownField *field;
  int i;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int iVar4;
  undefined4 local_5c;
  undefined8 local_50;
  
  local_5c = 0;
  local_50 = in_RSI;
  while( true ) {
    iVar4 = local_5c;
    iVar1 = UnknownFieldSet::field_count((UnknownFieldSet *)0x471add);
    if (iVar1 <= iVar4) break;
    this = UnknownFieldSet::field
                     ((UnknownFieldSet *)CONCAT44(iVar4,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
    TVar2 = UnknownField::type(this);
    if (TVar2 == TYPE_LENGTH_DELIMITED) {
      io::EpsCopyOutputStream::EnsureSpace
                ((EpsCopyOutputStream *)CONCAT44(iVar4,in_stack_ffffffffffffff90),
                 (uint8 **)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0xb,local_50);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(0x10,puVar3);
      value = UnknownField::number(this);
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(value,puVar3);
      io::CodedOutputStream::WriteVarint32ToArray(0x1a,puVar3);
      puVar3 = UnknownField::InternalSerializeLengthDelimitedNoTag
                         (field,in_stack_00000008,unaff_retaddr);
      io::EpsCopyOutputStream::EnsureSpace
                ((EpsCopyOutputStream *)CONCAT44(iVar4,in_stack_ffffffffffffff90),
                 (uint8 **)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_50 = io::CodedOutputStream::WriteVarint32ToArray(0xc,puVar3);
    }
    local_5c = local_5c + 1;
  }
  return local_50;
}

Assistant:

uint8* WireFormat::InternalSerializeUnknownMessageSetItemsToArray(
    const UnknownFieldSet& unknown_fields, uint8* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      stream->EnsureSpace(&target);
      // Start group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemStartTag, target);

      // Write type ID.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetTypeIdTag, target);
      target =
          io::CodedOutputStream::WriteVarint32ToArray(field.number(), target);

      // Write message.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetMessageTag, target);

      target = field.InternalSerializeLengthDelimitedNoTag(target, stream);

      stream->EnsureSpace(&target);
      // End group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemEndTag, target);
    }
  }

  return target;
}